

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::encode_bc1(void *pDst,uint8_t *pPixels,uint32_t flags)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint in_EDX;
  color32 *in_RSI;
  dxt1_block *in_RDI;
  uint32_t i_6;
  uint32_t packed_sels;
  uint8_t invert_mask;
  uint8_t mask;
  uint32_t hc16;
  uint32_t lc16;
  uint32_t i_5;
  int total_b_1;
  int total_g_1;
  int total_r_1;
  vec3F xh;
  vec3F xl;
  uint32_t ls_pass;
  uint32_t total_ls_passes;
  int dot;
  uint32_t i_4;
  int high_c;
  int low_c;
  int high_dot;
  int low_dot;
  float m;
  int saxis_b;
  int saxis_g;
  int saxis_r;
  float k;
  float b_2;
  float g_2;
  float r_2;
  uint32_t power_iter;
  float xb;
  float xg;
  float xr;
  uint32_t i_3;
  float cov [6];
  int b_1;
  int g_1;
  int r_1;
  uint32_t i_2;
  int icov [6];
  int b;
  int g;
  int r;
  uint32_t i_1;
  int min_b;
  int min_g;
  int min_r;
  int max_b;
  int max_g;
  int max_r;
  int total_b;
  int total_g;
  int total_r;
  uint32_t j;
  uint32_t fb;
  uint32_t fg;
  uint32_t fr;
  uint32_t i;
  uint32_t s;
  bool use_sels;
  uint8_t sels [16];
  int hb;
  int hg;
  int hr;
  int lb;
  int lg;
  int lr;
  int avg_b;
  int avg_g;
  int avg_r;
  dxt1_block *pDst_block;
  color32 *pSrc_pixels;
  float in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  uint32_t in_stack_fffffffffffffe64;
  uint32_t in_stack_fffffffffffffe68;
  uint uVar7;
  uint32_t in_stack_fffffffffffffe6c;
  undefined2 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe72;
  byte bVar8;
  undefined1 in_stack_fffffffffffffe73;
  uint8_t uVar9;
  uint in_stack_fffffffffffffe74;
  uint local_188;
  uint local_184;
  int local_180;
  int local_17c;
  int local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  uint local_15c;
  uint local_158;
  int local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  int local_144;
  int local_140;
  float local_13c;
  int local_138;
  int local_134;
  int local_130;
  float local_12c;
  float local_128;
  float local_124;
  float in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  uint local_dc;
  int local_d8 [8];
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  undefined1 local_69;
  byte local_68 [28];
  uint local_4c;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t local_38;
  int local_34;
  int local_30;
  int local_2c;
  dxt1_block *local_28;
  color32 *local_20;
  uint local_14;
  
  local_2c = -1;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_69 = (in_EDX & 4) != 0;
  local_28 = in_RDI;
  local_20 = in_RSI;
  local_14 = in_EDX;
  if ((bool)local_69) {
    local_70 = *(uint *)in_RDI->m_selectors;
    for (local_74 = 0; local_74 < 0x10; local_74 = local_74 + 1) {
      local_68[local_74] = ""[local_70 >> ((byte)(local_74 << 1) & 0x1f) & 3];
    }
  }
  else {
    local_a0 = (uint)(in_RSI->field_0).field_0.r;
    local_a4 = (uint)(in_RSI->field_0).field_0.g;
    local_a8 = (uint)(in_RSI->field_0).field_0.b;
    local_84 = 1;
    while ((((local_84 < 0x10 && (in_RSI[local_84].field_0.field_0.r == local_a0)) &&
            (in_RSI[local_84].field_0.field_0.g == local_a4)) &&
           (in_RSI[local_84].field_0.field_0.b == local_a8))) {
      local_84 = local_84 + 1;
    }
    local_80 = local_a8;
    local_7c = local_a4;
    local_78 = local_a0;
    if (local_84 == 0x10) {
      encode_bc1_solid_block
                ((void *)CONCAT44(in_stack_fffffffffffffe74,
                                  CONCAT13(in_stack_fffffffffffffe73,
                                           CONCAT12(in_stack_fffffffffffffe72,
                                                    in_stack_fffffffffffffe70))),
                 in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64);
      return;
    }
    local_9c = local_a8;
    local_98 = local_a4;
    local_94 = local_a0;
    local_90 = local_a8;
    local_8c = local_a4;
    local_88 = local_a0;
    for (local_ac = 1; local_ac < 0x10; local_ac = local_ac + 1) {
      local_b0 = (uint)local_20[local_ac].field_0.field_0.r;
      local_b4 = (uint)local_20[local_ac].field_0.field_0.g;
      local_b8 = (uint)local_20[local_ac].field_0.field_0.b;
      local_94 = basisu::maximum<int>(local_94,local_b0);
      local_98 = basisu::maximum<int>(local_98,local_b4);
      local_9c = basisu::maximum<int>(local_9c,local_b8);
      local_a0 = basisu::minimum<int>(local_a0,local_b0);
      local_a4 = basisu::minimum<int>(local_a4,local_b4);
      local_a8 = basisu::minimum<int>(local_a8,local_b8);
      local_88 = local_b0 + local_88;
      local_8c = local_b4 + local_8c;
      local_90 = local_b8 + local_90;
    }
    local_2c = (int)(local_88 + 8) >> 4;
    local_30 = (int)(local_8c + 8) >> 4;
    local_34 = (int)(local_90 + 8) >> 4;
    memset(local_d8,0,0x18);
    for (local_dc = 0; local_dc < 0x10; local_dc = local_dc + 1) {
      iVar3 = (uint)local_20[local_dc].field_0.field_0.r - local_2c;
      iVar4 = (uint)local_20[local_dc].field_0.field_0.g - local_30;
      iVar5 = (uint)local_20[local_dc].field_0.field_0.b - local_34;
      local_d8[0] = iVar3 * iVar3 + local_d8[0];
      local_d8[1] = iVar3 * iVar4 + local_d8[1];
      local_d8[2] = iVar3 * iVar5 + local_d8[2];
      local_d8[3] = iVar4 * iVar4 + local_d8[3];
      local_d8[4] = iVar4 * iVar5 + local_d8[4];
      local_d8[5] = iVar5 * iVar5 + local_d8[5];
    }
    for (in_stack_fffffffffffffef4 = 0; in_stack_fffffffffffffef4 < 6;
        in_stack_fffffffffffffef4 = in_stack_fffffffffffffef4 + 1) {
      *(float *)(&stack0xfffffffffffffef8 + (ulong)in_stack_fffffffffffffef4 * 4) =
           (float)local_d8[in_stack_fffffffffffffef4] * 0.003921569;
    }
    in_stack_fffffffffffffeec = (float)(int)(local_98 - local_a4);
    in_stack_fffffffffffffee8 = (float)(int)(local_9c - local_a8);
    in_stack_fffffffffffffef0 = (float)(int)(local_94 - local_a0);
    for (in_stack_fffffffffffffee4 = 0; in_stack_fffffffffffffee4 < 4;
        in_stack_fffffffffffffee4 = in_stack_fffffffffffffee4 + 1) {
      in_stack_fffffffffffffee0 =
           in_stack_fffffffffffffef0 * in_stack_fffffffffffffef8 +
           in_stack_fffffffffffffeec * in_stack_fffffffffffffefc +
           in_stack_fffffffffffffee8 * local_100;
      local_124 = in_stack_fffffffffffffef0 * in_stack_fffffffffffffefc +
                  in_stack_fffffffffffffeec * local_fc + in_stack_fffffffffffffee8 * local_f8;
      local_128 = in_stack_fffffffffffffef0 * local_100 + in_stack_fffffffffffffeec * local_f8 +
                  in_stack_fffffffffffffee8 * local_f4;
      in_stack_fffffffffffffee8 = local_128;
      in_stack_fffffffffffffeec = local_124;
      in_stack_fffffffffffffef0 = in_stack_fffffffffffffee0;
    }
    local_12c = basisu::maximum<float>
                          ((float)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                           (float)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    local_130 = 0x132;
    local_134 = 0x259;
    local_138 = 0x75;
    if (2.0 <= local_12c) {
      local_13c = 1024.0 / local_12c;
      local_130 = (int)(in_stack_fffffffffffffef0 * local_13c);
      local_134 = (int)(in_stack_fffffffffffffeec * local_13c);
      local_138 = (int)(in_stack_fffffffffffffee8 * local_13c);
    }
    local_140 = 0x7fffffff;
    local_144 = -0x80000000;
    local_148 = 0;
    local_14c = 0;
    for (local_150 = 0; local_150 < 0x10; local_150 = local_150 + 1) {
      local_154 = (uint)local_20[local_150].field_0.field_0.r * local_130 +
                  (uint)local_20[local_150].field_0.field_0.g * local_134 +
                  (uint)local_20[local_150].field_0.field_0.b * local_138;
      if (local_154 < local_140) {
        local_148 = local_150;
        local_140 = local_154;
      }
      if (local_144 < local_154) {
        local_14c = local_150;
        local_144 = local_154;
      }
    }
    bVar8 = to_5((uint)local_20[(int)local_148].field_0.field_0.r);
    local_38 = (uint32_t)bVar8;
    bVar8 = to_6((uint)local_20[(int)local_148].field_0.field_0.g);
    local_3c = (uint32_t)bVar8;
    bVar8 = to_5((uint)local_20[(int)local_148].field_0.field_0.b);
    local_40 = (uint32_t)bVar8;
    bVar8 = to_5((uint)local_20[(int)local_14c].field_0.field_0.r);
    local_44 = (uint32_t)bVar8;
    bVar8 = to_6((uint)local_20[(int)local_14c].field_0.field_0.g);
    local_48 = (uint32_t)bVar8;
    bVar8 = to_5((uint)local_20[(int)local_14c].field_0.field_0.b);
    local_4c = (uint)bVar8;
    bc1_find_sels(local_20,local_38,local_3c,local_40,local_44,local_48,local_4c,local_68);
  }
  if ((local_14 & 2) == 0) {
    local_158 = 1;
    if ((local_14 & 1) != 0) {
      local_158 = 2;
    }
  }
  else {
    local_158 = 3;
  }
  for (local_15c = 0; local_15c < local_158; local_15c = local_15c + 1) {
    bVar1 = compute_least_squares_endpoints_rgb
                      ((color32 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       (vec3F *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       (vec3F *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    if (bVar1) {
      local_38 = basisu::clamp<int>((int)(local_168 * 0.12156863 + 0.5),0,0x1f);
      local_3c = basisu::clamp<int>((int)(local_164 * 0.24705882 + 0.5),0,0x3f);
      local_40 = basisu::clamp<int>((int)(local_160 * 0.12156863 + 0.5),0,0x1f);
      local_44 = basisu::clamp<int>((int)(local_174 * 0.12156863 + 0.5),0,0x1f);
      local_48 = basisu::clamp<int>((int)(local_170 * 0.24705882 + 0.5),0,0x3f);
      local_4c = basisu::clamp<int>((int)(local_16c * 0.12156863 + 0.5),0,0x1f);
    }
    else {
      if (local_2c < 0) {
        local_178 = 0;
        local_17c = 0;
        local_180 = 0;
        for (local_184 = 0; local_184 < 0x10; local_184 = local_184 + 1) {
          local_178 = (uint)local_20[local_184].field_0.field_0.r + local_178;
          local_17c = (uint)local_20[local_184].field_0.field_0.g + local_17c;
          local_180 = (uint)local_20[local_184].field_0.field_0.b + local_180;
        }
        local_2c = local_178 + 8 >> 4;
        local_30 = local_17c + 8 >> 4;
        local_34 = local_180 + 8 >> 4;
      }
      local_38 = (uint32_t)(byte)g_bc1_match5_equals_1[(long)local_2c * 2];
      local_3c = (uint32_t)(byte)g_bc1_match6_equals_1[(long)local_30 * 2];
      local_40 = (uint32_t)(byte)g_bc1_match5_equals_1[(long)local_34 * 2];
      local_44 = (uint32_t)(byte)g_bc1_match5_equals_1[(long)local_2c * 2 + 1];
      local_48 = (uint32_t)(byte)g_bc1_match6_equals_1[(long)local_30 * 2 + 1];
      local_4c = (uint)(byte)g_bc1_match5_equals_1[(long)local_34 * 2 + 1];
    }
    bc1_find_sels(local_20,local_38,local_3c,local_40,local_44,local_48,local_4c,local_68);
  }
  uVar2 = dxt1_block::pack_unscaled_color(local_38,local_3c,local_40);
  local_188 = (uint)uVar2;
  uVar2 = dxt1_block::pack_unscaled_color(local_44,local_48,local_4c);
  uVar6 = (uint)uVar2;
  if (local_188 == uVar6) {
    uVar9 = '\0';
    if (uVar6 == 0) {
      if (local_188 != 0) {
        __assert_fail("lc16 == hc16 && hc16 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x3af5,"void basist::encode_bc1(void *, const uint8_t *, uint32_t)");
      }
      uVar6 = 0;
      local_188 = 1;
      uVar9 = 'U';
    }
    else {
      uVar6 = uVar6 - 1;
    }
    if (local_188 <= uVar6) {
      __assert_fail("lc16 > hc16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x3afc,"void basist::encode_bc1(void *, const uint8_t *, uint32_t)");
    }
    dxt1_block::set_low_color(local_28,(uint16_t)local_188);
    dxt1_block::set_high_color(local_28,(uint16_t)uVar6);
    local_28->m_selectors[0] = uVar9;
    local_28->m_selectors[1] = uVar9;
    local_28->m_selectors[2] = uVar9;
    local_28->m_selectors[3] = uVar9;
  }
  else {
    bVar8 = 0;
    if (local_188 < uVar6) {
      std::swap<unsigned_int>(&local_188,(uint *)&stack0xfffffffffffffe74);
      bVar8 = 0x55;
    }
    if (local_188 <= uVar6) {
      __assert_fail("lc16 > hc16",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x3b0e,"void basist::encode_bc1(void *, const uint8_t *, uint32_t)");
    }
    dxt1_block::set_low_color(local_28,(uint16_t)local_188);
    dxt1_block::set_high_color(local_28,(uint16_t)uVar6);
    uVar6 = 0;
    for (uVar7 = 0; uVar7 < 0x10; uVar7 = uVar7 + 1) {
      uVar6 = (uint)""[local_68[uVar7]] << ((byte)(uVar7 << 1) & 0x1f) | uVar6;
    }
    local_28->m_selectors[0] = (byte)uVar6 ^ bVar8;
    local_28->m_selectors[1] = (byte)(uVar6 >> 8) ^ bVar8;
    local_28->m_selectors[2] = (byte)(uVar6 >> 0x10) ^ bVar8;
    local_28->m_selectors[3] = (byte)(uVar6 >> 0x18) ^ bVar8;
  }
  return;
}

Assistant:

void encode_bc1(void* pDst, const uint8_t* pPixels, uint32_t flags)
	{
		const color32* pSrc_pixels = (const color32*)pPixels;
		dxt1_block* pDst_block = static_cast<dxt1_block*>(pDst);
		
		int avg_r = -1, avg_g = 0, avg_b = 0;
		int lr = 0, lg = 0, lb = 0, hr = 0, hg = 0, hb = 0;
		uint8_t sels[16];
		
		const bool use_sels = (flags & cEncodeBC1UseSelectors) != 0;
		if (use_sels)
		{
			// Caller is jamming in their own selectors for us to try.
			const uint32_t s = pDst_block->m_selectors[0] | (pDst_block->m_selectors[1] << 8) | (pDst_block->m_selectors[2] << 16) | (pDst_block->m_selectors[3] << 24);
			
			static const uint8_t s_sel_tran[4] = { 0, 3, 1, 2 };
			
			for (uint32_t i = 0; i < 16; i++)
				sels[i] = s_sel_tran[(s >> (i * 2)) & 3];
		}
		else
		{
			const uint32_t fr = pSrc_pixels[0].r, fg = pSrc_pixels[0].g, fb = pSrc_pixels[0].b;

			uint32_t j;
			for (j = 1; j < 16; j++)
				if ((pSrc_pixels[j].r != fr) || (pSrc_pixels[j].g != fg) || (pSrc_pixels[j].b != fb))
					break;
						
			if (j == 16)
			{
				encode_bc1_solid_block(pDst, fr, fg, fb);
				return;
			}
			
			// Select 2 colors along the principle axis. (There must be a faster/simpler way.)
			int total_r = fr, total_g = fg, total_b = fb;
			int max_r = fr, max_g = fg, max_b = fb;
			int min_r = fr, min_g = fg, min_b = fb;
			for (uint32_t i = 1; i < 16; i++)
			{
				const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
				max_r = basisu::maximum(max_r, r); max_g = basisu::maximum(max_g, g); max_b = basisu::maximum(max_b, b);
				min_r = basisu::minimum(min_r, r); min_g = basisu::minimum(min_g, g); min_b = basisu::minimum(min_b, b);
				total_r += r; total_g += g; total_b += b;
			}

			avg_r = (total_r + 8) >> 4;
			avg_g = (total_g + 8) >> 4;
			avg_b = (total_b + 8) >> 4;

			int icov[6] = { 0, 0, 0, 0, 0, 0 };
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov[0] += r * r;
				icov[1] += r * g;
				icov[2] += r * b;
				icov[3] += g * g;
				icov[4] += g * b;
				icov[5] += b * b;
			}

			float cov[6];
			for (uint32_t i = 0; i < 6; i++)
				cov[i] = static_cast<float>(icov[i])* (1.0f / 255.0f);
			
#if 0
			// Seems silly to use full PCA to choose 2 colors. The diff in avg. PSNR between using PCA vs. not is small (~.025 difference).
			// TODO: Try 2 or 3 different normalized diagonal vectors, choose the one that results in the largest dot delta
			int saxis_r = max_r - min_r;
			int saxis_g = max_g - min_g;
			int saxis_b = max_b - min_b;
#else
			float xr = (float)(max_r - min_r);
			float xg = (float)(max_g - min_g);
			float xb = (float)(max_b - min_b);
			//float xr = (float)(max_r - avg_r); // max-avg is nearly the same, and doesn't require computing min's
			//float xg = (float)(max_g - avg_g);
			//float xb = (float)(max_b - avg_b);
			for (uint32_t power_iter = 0; power_iter < 4; power_iter++)
			{
				float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
				float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
				float b = xr * cov[2] + xg * cov[4] + xb * cov[5];
				xr = r; xg = g; xb = b;
			}

			float k = basisu::maximum(fabsf(xr), fabsf(xg), fabsf(xb));
			int saxis_r = 306, saxis_g = 601, saxis_b = 117;
			if (k >= 2)
			{
				float m = 1024.0f / k;
				saxis_r = (int)(xr * m);
				saxis_g = (int)(xg * m);
				saxis_b = (int)(xb * m);
			}
#endif
			
			int low_dot = INT_MAX, high_dot = INT_MIN, low_c = 0, high_c = 0;
			for (uint32_t i = 0; i < 16; i++)
			{
				int dot = pSrc_pixels[i].r * saxis_r + pSrc_pixels[i].g * saxis_g + pSrc_pixels[i].b * saxis_b;
				if (dot < low_dot)
				{
					low_dot = dot;
					low_c = i;
				}
				if (dot > high_dot)
				{
					high_dot = dot;
					high_c = i;
				}
			}

			lr = to_5(pSrc_pixels[low_c].r);
			lg = to_6(pSrc_pixels[low_c].g);
			lb = to_5(pSrc_pixels[low_c].b);

			hr = to_5(pSrc_pixels[high_c].r);
			hg = to_6(pSrc_pixels[high_c].g);
			hb = to_5(pSrc_pixels[high_c].b);
						
			bc1_find_sels(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);
		} // if (use_sels)

		const uint32_t total_ls_passes = (flags & cEncodeBC1HigherQuality) ? 3 : (flags & cEncodeBC1HighQuality ? 2 : 1);
		for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
		{
			// This is where the real magic happens. We have an array of candidate selectors, so let's use least squares to compute the optimal low/high endpoint colors.
			vec3F xl, xh;
			if (!compute_least_squares_endpoints_rgb(pSrc_pixels, sels, &xl, &xh))
			{
				if (avg_r < 0)
				{
					int total_r = 0, total_g = 0, total_b = 0;
					for (uint32_t i = 0; i < 16; i++)
					{
						total_r += pSrc_pixels[i].r;
						total_g += pSrc_pixels[i].g;
						total_b += pSrc_pixels[i].b;
					}

					avg_r = (total_r + 8) >> 4;
					avg_g = (total_g + 8) >> 4;
					avg_b = (total_b + 8) >> 4;
				}

				// All selectors equal - treat it as a solid block which should always be equal or better.
				lr = g_bc1_match5_equals_1[avg_r].m_hi;
				lg = g_bc1_match6_equals_1[avg_g].m_hi;
				lb = g_bc1_match5_equals_1[avg_b].m_hi;

				hr = g_bc1_match5_equals_1[avg_r].m_lo;
				hg = g_bc1_match6_equals_1[avg_g].m_lo;
				hb = g_bc1_match5_equals_1[avg_b].m_lo;

				// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
			}
			else
			{
				lr = basisu::clamp((int)((xl.c[0]) * (31.0f / 255.0f) + .5f), 0, 31);
				lg = basisu::clamp((int)((xl.c[1]) * (63.0f / 255.0f) + .5f), 0, 63);
				lb = basisu::clamp((int)((xl.c[2]) * (31.0f / 255.0f) + .5f), 0, 31);

				hr = basisu::clamp((int)((xh.c[0]) * (31.0f / 255.0f) + .5f), 0, 31);
				hg = basisu::clamp((int)((xh.c[1]) * (63.0f / 255.0f) + .5f), 0, 63);
				hb = basisu::clamp((int)((xh.c[2]) * (31.0f / 255.0f) + .5f), 0, 31);
			}
									
			bc1_find_sels(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);
		}

		uint32_t lc16 = dxt1_block::pack_unscaled_color(lr, lg, lb);
		uint32_t hc16 = dxt1_block::pack_unscaled_color(hr, hg, hb);
				
		// Always forbid 3 color blocks
		if (lc16 == hc16)
		{
			uint8_t mask = 0;

			// Make l > h
			if (hc16 > 0)
				hc16--;
			else
			{
				// lc16 = hc16 = 0
				assert(lc16 == hc16 && hc16 == 0);

				hc16 = 0;
				lc16 = 1;
				mask = 0x55; // select hc16
			}

			assert(lc16 > hc16);
			pDst_block->set_low_color(static_cast<uint16_t>(lc16));
			pDst_block->set_high_color(static_cast<uint16_t>(hc16));

			pDst_block->m_selectors[0] = mask;
			pDst_block->m_selectors[1] = mask;
			pDst_block->m_selectors[2] = mask;
			pDst_block->m_selectors[3] = mask;
		}
		else
		{
			uint8_t invert_mask = 0;
			if (lc16 < hc16)
			{
				std::swap(lc16, hc16);
				invert_mask = 0x55;
			}

			assert(lc16 > hc16);
			pDst_block->set_low_color((uint16_t)lc16);
			pDst_block->set_high_color((uint16_t)hc16);

			uint32_t packed_sels = 0;
			static const uint8_t s_sel_trans[4] = { 0, 2, 3, 1 };
			for (uint32_t i = 0; i < 16; i++)
				packed_sels |= ((uint32_t)s_sel_trans[sels[i]] << (i * 2));

			pDst_block->m_selectors[0] = (uint8_t)packed_sels ^ invert_mask;
			pDst_block->m_selectors[1] = (uint8_t)(packed_sels >> 8) ^ invert_mask;
			pDst_block->m_selectors[2] = (uint8_t)(packed_sels >> 16) ^ invert_mask;
			pDst_block->m_selectors[3] = (uint8_t)(packed_sels >> 24) ^ invert_mask;
		}
	}